

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::ModuleUtils::(anonymous_namespace)::Counts,(wasm::
Mutability)0,wasm::InsertOrderedMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm
::Function*,wasm::ModuleUtils::(anonymous_namespace)::Counts&)>)::Mapper::doWalkFunction(wasm::
Function__(void *this,Function *curr)

{
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  __node_ptr p_Var1;
  Counts *__args_1;
  __hash_code __code;
  Function *local_28;
  Function *curr_local;
  
  this_00 = *(_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              **)((long)this + 0x110);
  local_28 = curr;
  p_Var1 = std::
           _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(this_00,(ulong)curr % this_00->_M_bucket_count,&local_28,
                          (__hash_code)&local_28);
  if (p_Var1 != (__node_ptr)0x0) {
    __args_1 = InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
               ::operator[]((InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                             *)this_00,&local_28);
    std::function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)>::
    operator()((function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)>
                *)((long)this + 0x118),curr,__args_1);
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                ,0x192,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::ModuleUtils::(anonymous namespace)::Counts, wasm::Immutable, wasm::InsertOrderedMap>::ParallelFunctionAnalysis(Module &, Func)::Mapper::doWalkFunction(Function *) [T = wasm::ModuleUtils::(anonymous namespace)::Counts, Mut = wasm::Immutable, MapT = wasm::InsertOrderedMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }